

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFraigPartitioned(Vec_Ptr_t *vStore,void *pParams)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Abc_Ntk_t *pAVar6;
  Vec_Ptr_t *p;
  Abc_Frame_t *pAVar7;
  Vec_Ptr_t *vOutsPtr;
  Vec_Ptr_t *p_00;
  Vec_Int_t *vOuts;
  Abc_Ntk_t *pAVar8;
  Abc_Ntk_t *pAVar9;
  int local_60;
  int local_5c;
  int k;
  int i;
  Abc_Ntk_t *pNtkFraig;
  Abc_Ntk_t *pNtkAig;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vOnePtr;
  Vec_Ptr_t *vFraigs;
  Vec_Ptr_t *vParts;
  void *pParams_local;
  Vec_Ptr_t *vStore_local;
  
  pAVar6 = (Abc_Ntk_t *)Vec_PtrEntry(vStore,0);
  iVar1 = Abc_NtkIsStrash(pAVar6);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x453,"Abc_Ntk_t *Abc_NtkFraigPartitioned(Vec_Ptr_t *, void *)");
  }
  p = Abc_NtkPartitionSmart(pAVar6,300,0);
  pAVar7 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar7,"unset progressbar");
  vOutsPtr = Vec_PtrAlloc(1000);
  iVar1 = Vec_PtrSize(p);
  p_00 = Vec_PtrAlloc(iVar1);
  for (local_5c = 0; iVar1 = Vec_PtrSize(p), local_5c < iVar1; local_5c = local_5c + 1) {
    vOuts = (Vec_Int_t *)Vec_PtrEntry(p,local_5c);
    Abc_NtkConvertCos(pAVar6,vOuts,vOutsPtr);
    pAVar9 = Abc_NtkCreateConeArray(pAVar6,vOutsPtr,0);
    for (local_60 = 1; iVar1 = Vec_PtrSize(vStore), local_60 < iVar1; local_60 = local_60 + 1) {
      pAVar8 = (Abc_Ntk_t *)Vec_PtrEntry(vStore,local_60);
      Abc_NtkConvertCos(pAVar8,vOuts,vOutsPtr);
      Abc_NtkAppendToCone(pAVar9,pAVar8,vOutsPtr);
    }
    uVar2 = Vec_PtrSize(p);
    uVar3 = Abc_NtkPiNum(pAVar9);
    uVar4 = Abc_NtkPoNum(pAVar9);
    uVar5 = Abc_NtkNodeNum(pAVar9);
    iVar1 = Abc_AigLevel(pAVar9);
    printf("Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
           (ulong)(local_5c + 1),(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar1);
    pAVar8 = Abc_NtkFraig(pAVar9,pParams,1,0);
    Vec_PtrPush(p_00,pAVar8);
    Abc_NtkDelete(pAVar9);
  }
  printf(
        "                                                                                          \r"
        );
  Vec_VecFree((Vec_Vec_t *)p);
  pAVar7 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar7,"set progressbar");
  pAVar6 = Abc_NtkPartStitchChoices(pAVar6,p_00);
  for (local_5c = 0; iVar1 = Vec_PtrSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
    pAVar9 = (Abc_Ntk_t *)Vec_PtrEntry(p_00,local_5c);
    Abc_NtkDelete(pAVar9);
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(vOutsPtr);
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigPartitioned( Vec_Ptr_t * vStore, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtk, * pNtk2, * pNtkAig, * pNtkFraig;
    int i, k;

    // perform partitioning
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( vStore, 0 );
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // start the partition 
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        // add nodes to the partition
        Vec_PtrForEachEntryStart( Abc_Ntk_t *, vStore, pNtk2, k, 1 )
        {
            Abc_NtkConvertCos( pNtk2, vOne, vOnePtr );
            Abc_NtkAppendToCone( pNtkAig, pNtk2, vOnePtr );
        }
        printf( "Fraiging part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pNtkAig), Abc_NtkPoNum(pNtkAig), 
            Abc_NtkNodeNum(pNtkAig), Abc_AigLevel(pNtkAig) );
        // fraig the partition
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 1, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    pNtkFraig = Abc_NtkPartStitchChoices( pNtk, vFraigs );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    return pNtkFraig;
}